

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O3

int av1_selfguided_restoration_avx2
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  int32_t iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  void *memblk;
  void *__s;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  void *pvVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  uint8_t *puVar27;
  long lVar28;
  long lVar29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  __m128i shift_a;
  __m128i shift_b;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 in_ZMM11 [64];
  __m256i mask [8];
  int32_t *local_198;
  int32_t *local_168;
  undefined1 local_160 [304];
  
  memblk = aom_memalign(0x20,0x1fa80);
  if (memblk == (void *)0x0) {
    iVar14 = -1;
  }
  else {
    uVar13 = width + 0x1dU & 0xfffffff8;
    pvVar11 = (void *)((long)memblk + 0xfd5c);
    __s = (void *)((long)memblk + 0x17bfc);
    lVar5 = (long)(int)uVar13;
    puVar27 = dgd8 + (dgd_stride * -3 + -3);
    uVar8 = width + 0xe;
    uVar6 = (ulong)(int)uVar8;
    if (highbd == 0) {
      uVar12 = uVar6 & 0xffffffe0;
      if (uVar12 == 0) {
        uVar26 = 0;
      }
      else {
        memset(pvVar11,0,(uVar12 - 1 & 0x1fffffffffffffe0) * 4 + 0x80);
        uVar26 = (ulong)(((uint)(uVar12 - 1) & 0xffffffe0) + 0x20);
      }
      uVar9 = (ulong)(uVar8 & 0xfffffff8);
      uVar24 = (uint)uVar26;
      if (uVar26 < uVar9) {
        uVar25 = ~uVar26 + uVar9 & 0xfffffffffffffff8;
        memset((void *)((long)pvVar11 + uVar26 * 4),0,uVar25 * 4 + 0x20);
        uVar26 = uVar25 + uVar26 + 8;
        uVar24 = (uint)uVar26;
        uVar26 = uVar26 & 0xffffffff;
      }
      while (uVar26 < uVar6) {
        uVar24 = uVar24 + 1;
        *(undefined4 *)((long)pvVar11 + uVar26 * 4) = 0;
        uVar26 = (ulong)uVar24;
      }
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else {
        memset(__s,0,(uVar12 - 0x20) * 4 + 0x80);
      }
      uVar24 = (uint)uVar12;
      if (uVar24 < (uVar8 & 0xfffffff8)) {
        uVar26 = uVar9 + ~uVar12 & 0xfffffffffffffff8;
        memset((void *)((long)__s + uVar12 * 4),0,uVar26 * 4 + 0x20);
        uVar12 = uVar12 + uVar26 + 8;
        uVar24 = (uint)uVar12;
        uVar12 = uVar12 & 0xffffffff;
      }
      while (uVar12 < uVar6) {
        uVar24 = uVar24 + 1;
        *(undefined4 *)((long)__s + uVar12 * 4) = 0;
        uVar12 = (ulong)uVar24;
      }
      if (-6 < height) {
        lVar28 = (long)memblk + lVar5 * 4 + 0x17c00;
        lVar15 = (long)memblk + 0x17c00;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + 1;
          *(undefined4 *)((long)__s + uVar6 * lVar5 * 4) = 0;
          *(undefined4 *)((long)pvVar11 + uVar6 * lVar5 * 4) = 0;
          if (-6 < width) {
            auVar35 = ZEXT1664((undefined1  [16])0x0);
            lVar16 = 0;
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar33 = *(undefined1 (*) [32])(lVar15 + lVar16 * 4);
              auVar52 = *(undefined1 (*) [32])(lVar15 + -0x7ea0 + lVar16 * 4);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)(puVar27 + lVar16);
              auVar40 = vpmovzxbd_avx2(auVar2);
              auVar41 = vpmaddwd_avx2(auVar40,auVar40);
              auVar43 = vpslldq_avx2(auVar40,4);
              auVar40 = vpaddd_avx2(auVar43,auVar40);
              auVar43 = vpslldq_avx2(auVar40,8);
              auVar40 = vpaddd_avx2(auVar40,auVar43);
              auVar2 = vpshufd_avx(auVar40._0_16_,0xff);
              auVar48._16_16_ = ZEXT116(1) * auVar2;
              auVar48._0_16_ = ZEXT116(0) * auVar2;
              auVar43 = vpslldq_avx2(auVar41,4);
              auVar41 = vpaddd_avx2(auVar43,auVar41);
              auVar43 = vpslldq_avx2(auVar41,8);
              auVar41 = vpaddd_avx2(auVar43,auVar41);
              auVar2 = vpshufd_avx(auVar41._0_16_,0xff);
              auVar49._16_16_ = ZEXT116(1) * auVar2;
              auVar49._0_16_ = ZEXT116(0) * auVar2;
              auVar43 = vpaddd_avx2(auVar33,auVar35._0_32_);
              auVar40 = vpaddd_avx2(auVar43,auVar40);
              auVar40 = vpaddd_avx2(auVar40,auVar48);
              auVar43 = vpaddd_avx2(auVar52,auVar37._0_32_);
              auVar41 = vpaddd_avx2(auVar43,auVar41);
              auVar41 = vpaddd_avx2(auVar49,auVar41);
              *(undefined1 (*) [32])(lVar28 + lVar16 * 4) = auVar40;
              *(undefined1 (*) [32])(lVar28 + -0x7ea0 + lVar16 * 4) = auVar41;
              auVar33 = vpsubd_avx2(auVar40,auVar33);
              auVar33 = vpshufd_avx2(auVar33,0xff);
              auVar33 = vpermq_avx2(auVar33,0xaa);
              auVar35 = ZEXT3264(auVar33);
              auVar33 = vpsubd_avx2(auVar41,auVar52);
              auVar33 = vpshufd_avx2(auVar33,0xff);
              auVar33 = vpermq_avx2(auVar33,0xaa);
              auVar37 = ZEXT3264(auVar33);
              lVar16 = lVar16 + 8;
            } while (lVar16 < width + 6);
          }
          puVar27 = puVar27 + dgd_stride;
          lVar28 = lVar28 + lVar5 * 4;
          lVar15 = lVar15 + lVar5 * 4;
        } while (uVar6 != height + 6U);
      }
    }
    else {
      uVar12 = uVar6 & 0xffffffe0;
      if (uVar12 == 0) {
        uVar26 = 0;
      }
      else {
        memset(pvVar11,0,(uVar12 - 1 & 0x1fffffffffffffe0) * 4 + 0x80);
        uVar26 = (ulong)(((uint)(uVar12 - 1) & 0xffffffe0) + 0x20);
      }
      uVar9 = (ulong)(uVar8 & 0xfffffff8);
      uVar24 = (uint)uVar26;
      if (uVar26 < uVar9) {
        uVar25 = ~uVar26 + uVar9 & 0xfffffffffffffff8;
        memset((void *)((long)pvVar11 + uVar26 * 4),0,uVar25 * 4 + 0x20);
        uVar26 = uVar25 + uVar26 + 8;
        uVar24 = (uint)uVar26;
        uVar26 = uVar26 & 0xffffffff;
      }
      while (uVar26 < uVar6) {
        uVar24 = uVar24 + 1;
        *(undefined4 *)((long)pvVar11 + uVar26 * 4) = 0;
        uVar26 = (ulong)uVar24;
      }
      if (uVar12 == 0) {
        uVar12 = 0;
      }
      else {
        memset(__s,0,(uVar12 - 0x20) * 4 + 0x80);
      }
      uVar24 = (uint)uVar12;
      if (uVar24 < (uVar8 & 0xfffffff8)) {
        uVar26 = uVar9 + ~uVar12 & 0xfffffffffffffff8;
        memset((void *)((long)__s + uVar12 * 4),0,uVar26 * 4 + 0x20);
        uVar12 = uVar12 + uVar26 + 8;
        uVar24 = (uint)uVar12;
        uVar12 = uVar12 & 0xffffffff;
      }
      while (uVar12 < uVar6) {
        uVar24 = uVar24 + 1;
        *(undefined4 *)((long)__s + uVar12 * 4) = 0;
        uVar12 = (ulong)uVar24;
      }
      if (-6 < height) {
        lVar28 = (long)puVar27 * 2;
        lVar15 = (long)memblk + lVar5 * 4 + 0x17c00;
        lVar16 = (long)memblk + 0x17c00;
        uVar6 = 0;
        do {
          uVar6 = uVar6 + 1;
          *(undefined4 *)((long)__s + uVar6 * lVar5 * 4) = 0;
          *(undefined4 *)((long)pvVar11 + uVar6 * lVar5 * 4) = 0;
          if (-6 < width) {
            auVar35 = ZEXT1664((undefined1  [16])0x0);
            lVar21 = 0;
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar33 = *(undefined1 (*) [32])(lVar16 + lVar21 * 4);
              auVar52 = *(undefined1 (*) [32])(lVar16 + -0x7ea0 + lVar21 * 4);
              auVar40 = vpmovzxwd_avx2(*(undefined1 (*) [16])(lVar28 + lVar21 * 2));
              auVar41 = vpmaddwd_avx2(auVar40,auVar40);
              auVar43 = vpslldq_avx2(auVar40,4);
              auVar40 = vpaddd_avx2(auVar43,auVar40);
              auVar43 = vpslldq_avx2(auVar40,8);
              auVar40 = vpaddd_avx2(auVar40,auVar43);
              auVar2 = vpshufd_avx(auVar40._0_16_,0xff);
              auVar44._16_16_ = ZEXT116(1) * auVar2;
              auVar44._0_16_ = ZEXT116(0) * auVar2;
              auVar43 = vpslldq_avx2(auVar41,4);
              auVar41 = vpaddd_avx2(auVar43,auVar41);
              auVar43 = vpslldq_avx2(auVar41,8);
              auVar41 = vpaddd_avx2(auVar43,auVar41);
              auVar2 = vpshufd_avx(auVar41._0_16_,0xff);
              auVar47._16_16_ = ZEXT116(1) * auVar2;
              auVar47._0_16_ = ZEXT116(0) * auVar2;
              auVar43 = vpaddd_avx2(auVar33,auVar35._0_32_);
              auVar40 = vpaddd_avx2(auVar43,auVar40);
              auVar40 = vpaddd_avx2(auVar40,auVar44);
              auVar43 = vpaddd_avx2(auVar52,auVar37._0_32_);
              auVar41 = vpaddd_avx2(auVar43,auVar41);
              auVar41 = vpaddd_avx2(auVar47,auVar41);
              *(undefined1 (*) [32])(lVar15 + lVar21 * 4) = auVar40;
              *(undefined1 (*) [32])(lVar15 + -0x7ea0 + lVar21 * 4) = auVar41;
              auVar33 = vpsubd_avx2(auVar40,auVar33);
              auVar33 = vpshufd_avx2(auVar33,0xff);
              auVar33 = vpermq_avx2(auVar33,0xaa);
              auVar35 = ZEXT3264(auVar33);
              auVar33 = vpsubd_avx2(auVar41,auVar52);
              auVar33 = vpshufd_avx2(auVar33,0xff);
              auVar33 = vpermq_avx2(auVar33,0xaa);
              auVar37 = ZEXT3264(auVar33);
              lVar21 = lVar21 + 8;
            } while (lVar21 < width + 6);
          }
          lVar28 = lVar28 + (long)dgd_stride * 2;
          lVar15 = lVar15 + lVar5 * 4;
          lVar16 = lVar16 + lVar5 * 4;
        } while (uVar6 != height + 6U);
      }
    }
    lVar28 = (long)sgr_params_idx;
    uVar8 = av1_sgr_params[lVar28].r[0];
    bVar7 = (byte)highbd;
    if (0 < (int)uVar8) {
      iVar4 = uVar8 * 2 + 1;
      iVar4 = iVar4 * iVar4;
      iVar14 = av1_sgr_params[lVar28].s[0];
      iVar1 = av1_one_by_x[iVar4 - 1];
      lVar15 = 0x40;
      pauVar18 = (undefined1 (*) [32])local_160;
      auVar2 = vpmovsxbq_avx(ZEXT216(0xff));
      do {
        auVar3 = vpsrlq_avx(auVar2,ZEXT416((uint)lVar15));
        auVar33 = vpmovsxbd_avx2(auVar3);
        *pauVar18 = auVar33;
        pauVar18 = pauVar18 + 1;
        lVar15 = lVar15 + -8;
      } while (lVar15 != 0);
      if (-2 < height) {
        auVar33._4_4_ = iVar14;
        auVar33._0_4_ = iVar14;
        auVar33._8_4_ = iVar14;
        auVar33._12_4_ = iVar14;
        auVar33._16_4_ = iVar14;
        auVar33._20_4_ = iVar14;
        auVar33._24_4_ = iVar14;
        auVar33._28_4_ = iVar14;
        auVar52._4_4_ = iVar1;
        auVar52._0_4_ = iVar1;
        auVar52._8_4_ = iVar1;
        auVar52._12_4_ = iVar1;
        auVar52._16_4_ = iVar1;
        auVar52._20_4_ = iVar1;
        auVar52._24_4_ = iVar1;
        auVar52._28_4_ = iVar1;
        lVar19 = (long)(int)((uVar8 + 1) * uVar13);
        auVar40._4_4_ = iVar4;
        auVar40._0_4_ = iVar4;
        auVar40._8_4_ = iVar4;
        auVar40._12_4_ = iVar4;
        auVar40._16_4_ = iVar4;
        auVar40._20_4_ = iVar4;
        auVar40._24_4_ = iVar4;
        auVar40._28_4_ = iVar4;
        uVar24 = bit_depth * 2 - 0x10;
        uVar10 = (uint)(1 << ((byte)uVar24 & 0x1f)) >> 1;
        auVar41._4_4_ = uVar10;
        auVar41._0_4_ = uVar10;
        auVar41._8_4_ = uVar10;
        auVar41._12_4_ = uVar10;
        auVar41._16_4_ = uVar10;
        auVar41._20_4_ = uVar10;
        auVar41._24_4_ = uVar10;
        auVar41._28_4_ = uVar10;
        iVar14 = (1 << ((byte)(bit_depth - 8U) & 0x1f)) >> 1;
        auVar43._4_4_ = iVar14;
        auVar43._0_4_ = iVar14;
        auVar43._8_4_ = iVar14;
        auVar43._12_4_ = iVar14;
        auVar43._16_4_ = iVar14;
        auVar43._20_4_ = iVar14;
        auVar43._24_4_ = iVar14;
        auVar43._28_4_ = iVar14;
        lVar21 = (long)width;
        lVar23 = (long)(int)(uVar13 * 3);
        pvVar11 = (void *)((long)memblk + lVar23 * 4);
        lVar16 = lVar5 * 8;
        lVar15 = lVar23 * 4 + (long)(int)(uVar8 * uVar13) * 4;
        lVar20 = (long)memblk + lVar15 + (ulong)uVar8 * 4 + 0xfd68;
        lVar22 = (long)memblk + (ulong)uVar8 * 4 + lVar23 * 4 + lVar19 * -4 + 0xfd68;
        lVar15 = (long)memblk + lVar15 + (long)(int)~uVar8 * 4 + 0xfd68;
        lVar19 = (long)memblk + (long)(int)~uVar8 * 4 + lVar23 * 4 + lVar19 * -4 + 0xfd68;
        lVar29 = -1;
        auVar45._8_4_ = 0x80000;
        auVar45._0_8_ = 0x8000000080000;
        auVar45._12_4_ = 0x80000;
        auVar45._16_4_ = 0x80000;
        auVar45._20_4_ = 0x80000;
        auVar45._24_4_ = 0x80000;
        auVar45._28_4_ = 0x80000;
        do {
          if (-2 < width) {
            lVar17 = -1;
            iVar14 = width + 2;
            do {
              auVar48 = vpaddd_avx2(*(undefined1 (*) [32])(lVar22 + 0x7ea4 + lVar17 * 4),
                                    *(undefined1 (*) [32])(lVar15 + 0x7ea4 + lVar17 * 4));
              auVar48 = vpsubd_avx2(*(undefined1 (*) [32])(lVar19 + 0x7ea4 + lVar17 * 4),auVar48);
              auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])(lVar20 + 0x7ea4 + lVar17 * 4));
              auVar49 = vpaddd_avx2(*(undefined1 (*) [32])(lVar22 + 4 + lVar17 * 4),
                                    *(undefined1 (*) [32])(lVar15 + 4 + lVar17 * 4));
              auVar49 = vpsubd_avx2(*(undefined1 (*) [32])(lVar19 + 4 + lVar17 * 4),auVar49);
              auVar49 = vpaddd_avx2(auVar49,*(undefined1 (*) [32])(lVar20 + 4 + lVar17 * 4));
              if (iVar14 < 8) {
                auVar48 = vpand_avx2(*(undefined1 (*) [32])(local_160 + (long)iVar14 * 0x20),auVar48
                                    );
                auVar49 = vpand_avx2(auVar49,*(undefined1 (*) [32])(local_160 + (long)iVar14 * 0x20)
                                    );
              }
              if (bit_depth < 9) {
                auVar44 = vpmaddwd_avx2(auVar48,auVar48);
                auVar49 = vpmulld_avx2(auVar49,auVar40);
              }
              else {
                auVar49 = vpaddd_avx2(auVar49,auVar41);
                auVar47 = vpsrld_avx2(auVar49,ZEXT416(uVar24));
                auVar49 = vpaddd_avx2(auVar48,auVar43);
                auVar49 = vpsrld_avx2(auVar49,ZEXT416(bit_depth - 8U));
                auVar44 = vpmaddwd_avx2(auVar49,auVar49);
                auVar49 = vpmulld_avx2(auVar47,auVar40);
                auVar49 = vpmaxsd_avx2(auVar49,auVar44);
              }
              auVar49 = vpsubd_avx2(auVar49,auVar44);
              auVar49 = vpmulld_avx2(auVar49,auVar33);
              auVar49 = vpaddd_avx2(auVar49,auVar45);
              auVar49 = vpsrld_avx2(auVar49,0x14);
              auVar55._8_4_ = 0xff;
              auVar55._0_8_ = 0xff000000ff;
              auVar55._12_4_ = 0xff;
              auVar55._16_4_ = 0xff;
              auVar55._20_4_ = 0xff;
              auVar55._24_4_ = 0xff;
              auVar55._28_4_ = 0xff;
              vpminud_avx2(auVar49,auVar55);
              auVar49 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
              auVar49 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar49);
              in_ZMM11 = ZEXT3264((undefined1  [32])0x0);
              auVar50._8_4_ = 0x100;
              auVar50._0_8_ = 0x10000000100;
              auVar50._12_4_ = 0x100;
              auVar50._16_4_ = 0x100;
              auVar50._20_4_ = 0x100;
              auVar50._24_4_ = 0x100;
              auVar50._28_4_ = 0x100;
              *(undefined1 (*) [32])((long)pvVar11 + lVar17 * 4 + 0x2c) = auVar49;
              auVar49 = vpsubd_avx2(auVar50,auVar49);
              auVar49 = vpmaddwd_avx2(auVar49,auVar52);
              auVar48 = vpmulld_avx2(auVar49,auVar48);
              auVar51._8_4_ = 0x800;
              auVar51._0_8_ = 0x80000000800;
              auVar51._12_4_ = 0x800;
              auVar51._16_4_ = 0x800;
              auVar51._20_4_ = 0x800;
              auVar51._24_4_ = 0x800;
              auVar51._28_4_ = 0x800;
              auVar48 = vpaddd_avx2(auVar48,auVar51);
              auVar48 = vpsrld_avx2(auVar48,0xc);
              *(undefined1 (*) [32])((long)pvVar11 + lVar17 * 4 + 0x7ecc) = auVar48;
              lVar17 = lVar17 + 8;
              iVar14 = iVar14 + -8;
            } while (lVar17 <= lVar21);
          }
          lVar29 = lVar29 + 2;
          pvVar11 = (void *)((long)pvVar11 + lVar16);
          lVar20 = lVar20 + lVar16;
          lVar22 = lVar22 + lVar16;
          lVar15 = lVar15 + lVar16;
          lVar19 = lVar19 + lVar16;
        } while (lVar29 <= height);
        puVar27 = (uint8_t *)((long)dgd8 * 2);
        if (highbd == 0) {
          puVar27 = dgd8;
        }
        if (0 < height) {
          lVar15 = lVar5 * 4;
          lVar16 = (long)memblk + lVar5 * 4 + lVar23 * 4 + 0x7ed0;
          lVar19 = (long)memblk + lVar5 * 8 + lVar23 * 4 + 0x7ed0;
          lVar20 = (long)memblk + lVar23 * 4 + 0x7ed0;
          iVar14 = 0;
          auVar30._8_4_ = 0x100;
          auVar30._0_8_ = 0x10000000100;
          auVar30._12_4_ = 0x100;
          auVar30._16_4_ = 0x100;
          auVar30._20_4_ = 0x100;
          auVar30._24_4_ = 0x100;
          auVar30._28_4_ = 0x100;
          uVar6 = 0;
          local_198 = flt0;
          do {
            if ((uVar6 & 1) == 0) {
              if (0 < width) {
                lVar22 = 0;
                do {
                  if (highbd == 0) {
                    auVar33 = vpmovzxbd_avx2(*(undefined1 (*) [16])
                                              (puVar27 + (iVar14 + (int)lVar22 << (bVar7 & 0x1f))));
                  }
                  else {
                    auVar33 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                              (puVar27 + (iVar14 + (int)lVar22 << (bVar7 & 0x1f))));
                  }
                  auVar52 = vpaddd_avx2(*(undefined1 (*) [32])(lVar19 + -0x7ea4 + lVar22 * 4),
                                        *(undefined1 (*) [32])(lVar20 + -0x7ea4 + lVar22 * 4));
                  auVar40 = vpaddd_avx2(*(undefined1 (*) [32])(lVar20 + -0x7ea0 + lVar22 * 4),
                                        *(undefined1 (*) [32])(lVar20 + -0x7ea8 + lVar22 * 4));
                  auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])
                                                 (lVar19 + -0x7ea8 + lVar22 * 4));
                  auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])
                                                 (lVar19 + -0x7ea0 + lVar22 * 4));
                  auVar40 = vpaddd_avx2(auVar40,auVar52);
                  auVar41 = vpslld_avx2(auVar40,2);
                  auVar52 = vpaddd_avx2(auVar40,auVar52);
                  auVar52 = vpaddd_avx2(auVar52,auVar41);
                  auVar40 = vpmaddwd_avx2(auVar52,auVar33);
                  auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(lVar19 + -4 + lVar22 * 4),
                                        *(undefined1 (*) [32])(lVar20 + -4 + lVar22 * 4));
                  auVar52 = vpaddd_avx2(*(undefined1 (*) [32])(lVar20 + lVar22 * 4),
                                        *(undefined1 (*) [32])(lVar20 + -8 + lVar22 * 4));
                  auVar52 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar19 + -8 + lVar22 * 4));
                  auVar52 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar19 + lVar22 * 4));
                  auVar52 = vpaddd_avx2(auVar52,auVar33);
                  auVar41 = vpslld_avx2(auVar52,2);
                  auVar52 = vpaddd_avx2(auVar52,auVar41);
                  auVar33 = vpaddd_avx2(auVar33,auVar52);
                  auVar33 = vpaddd_avx2(auVar33,auVar30);
                  auVar33 = vpaddd_avx2(auVar33,auVar40);
                  auVar33 = vpsrad_avx2(auVar33,9);
                  *(undefined1 (*) [32])(local_198 + lVar22) = auVar33;
                  lVar22 = lVar22 + 8;
                } while (lVar22 < lVar21);
              }
            }
            else if (0 < width) {
              lVar22 = 0;
              do {
                if (highbd == 0) {
                  auVar33 = vpmovzxbd_avx2(*(undefined1 (*) [16])
                                            (puVar27 + (iVar14 + (int)lVar22 << (bVar7 & 0x1f))));
                }
                else {
                  auVar33 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                            (puVar27 + (iVar14 + (int)lVar22 << (bVar7 & 0x1f))));
                }
                auVar52 = *(undefined1 (*) [32])(lVar16 + -0x7ea4 + lVar22 * 4);
                auVar40 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar16 + -0x7ea8 + lVar22 * 4))
                ;
                auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])(lVar16 + -0x7ea0 + lVar22 * 4))
                ;
                auVar41 = vpslld_avx2(auVar40,2);
                auVar52 = vpaddd_avx2(auVar40,auVar52);
                auVar40 = vpaddd_avx2(auVar52,auVar41);
                auVar52 = *(undefined1 (*) [32])(lVar16 + -4 + lVar22 * 4);
                auVar41 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar16 + -8 + lVar22 * 4));
                auVar41 = vpaddd_avx2(auVar41,*(undefined1 (*) [32])(lVar16 + lVar22 * 4));
                auVar40 = vpmaddwd_avx2(auVar40,auVar33);
                auVar33 = vpslld_avx2(auVar41,2);
                auVar33 = vpaddd_avx2(auVar41,auVar33);
                auVar33 = vpaddd_avx2(auVar52,auVar33);
                auVar38._8_4_ = 0x80;
                auVar38._0_8_ = 0x8000000080;
                auVar38._12_4_ = 0x80;
                auVar38._16_4_ = 0x80;
                auVar38._20_4_ = 0x80;
                auVar38._24_4_ = 0x80;
                auVar38._28_4_ = 0x80;
                auVar33 = vpaddd_avx2(auVar33,auVar38);
                auVar33 = vpaddd_avx2(auVar33,auVar40);
                auVar33 = vpsrad_avx2(auVar33,8);
                *(undefined1 (*) [32])(local_198 + lVar22) = auVar33;
                lVar22 = lVar22 + 8;
              } while (lVar22 < lVar21);
            }
            uVar6 = uVar6 + 1;
            local_198 = local_198 + flt_stride;
            iVar14 = iVar14 + dgd_stride;
            lVar16 = lVar16 + lVar15;
            lVar19 = lVar19 + lVar15;
            lVar20 = lVar20 + lVar15;
          } while (uVar6 != (uint)height);
        }
      }
    }
    uVar8 = av1_sgr_params[lVar28].r[1];
    if (0 < (int)uVar8) {
      iVar4 = uVar8 * 2 + 1;
      iVar4 = iVar4 * iVar4;
      iVar14 = av1_sgr_params[lVar28].s[1];
      iVar1 = av1_one_by_x[iVar4 - 1];
      lVar28 = 0x40;
      pauVar18 = (undefined1 (*) [32])local_160;
      auVar2 = vpmovsxbq_avx(ZEXT216(0xff));
      do {
        auVar3 = vpsrlq_avx(auVar2,ZEXT416((uint)lVar28));
        auVar33 = vpmovsxbd_avx2(auVar3);
        *pauVar18 = auVar33;
        pauVar18 = pauVar18 + 1;
        lVar28 = lVar28 + -8;
      } while (lVar28 != 0);
      if (-2 < height) {
        auVar31._4_4_ = iVar14;
        auVar31._0_4_ = iVar14;
        auVar31._8_4_ = iVar14;
        auVar31._12_4_ = iVar14;
        auVar31._16_4_ = iVar14;
        auVar31._20_4_ = iVar14;
        auVar31._24_4_ = iVar14;
        auVar31._28_4_ = iVar14;
        auVar34._4_4_ = iVar1;
        auVar34._0_4_ = iVar1;
        auVar34._8_4_ = iVar1;
        auVar34._12_4_ = iVar1;
        auVar34._16_4_ = iVar1;
        auVar34._20_4_ = iVar1;
        auVar34._24_4_ = iVar1;
        auVar34._28_4_ = iVar1;
        lVar20 = (long)(int)((uVar8 + 1) * uVar13);
        auVar36._4_4_ = iVar4;
        auVar36._0_4_ = iVar4;
        auVar36._8_4_ = iVar4;
        auVar36._12_4_ = iVar4;
        auVar36._16_4_ = iVar4;
        auVar36._20_4_ = iVar4;
        auVar36._24_4_ = iVar4;
        auVar36._28_4_ = iVar4;
        uVar24 = bit_depth * 2 - 0x10;
        uVar10 = (uint)(1 << ((byte)uVar24 & 0x1f)) >> 1;
        auVar39._4_4_ = uVar10;
        auVar39._0_4_ = uVar10;
        auVar39._8_4_ = uVar10;
        auVar39._12_4_ = uVar10;
        auVar39._16_4_ = uVar10;
        auVar39._20_4_ = uVar10;
        auVar39._24_4_ = uVar10;
        auVar39._28_4_ = uVar10;
        iVar14 = (1 << ((byte)(bit_depth - 8U) & 0x1f)) >> 1;
        auVar42._4_4_ = iVar14;
        auVar42._0_4_ = iVar14;
        auVar42._8_4_ = iVar14;
        auVar42._12_4_ = iVar14;
        auVar42._16_4_ = iVar14;
        auVar42._20_4_ = iVar14;
        auVar42._24_4_ = iVar14;
        auVar42._28_4_ = iVar14;
        lVar16 = (long)(int)(uVar13 * 3);
        pvVar11 = (void *)((long)memblk + lVar16 * 4);
        lVar15 = lVar5 * 4;
        lVar28 = lVar16 * 4 + (long)(int)(uVar8 * uVar13) * 4;
        lVar21 = (long)memblk + lVar28 + (ulong)uVar8 * 4 + 0xfd68;
        lVar19 = (long)memblk + (ulong)uVar8 * 4 + lVar16 * 4 + lVar20 * -4 + 0xfd68;
        lVar28 = (long)memblk + lVar28 + (long)(int)~uVar8 * 4 + 0xfd68;
        lVar20 = (long)memblk + (long)(int)~uVar8 * 4 + lVar16 * 4 + lVar20 * -4 + 0xfd68;
        uVar6 = 0xffffffffffffffff;
        auVar46._8_4_ = 0x80000;
        auVar46._0_8_ = 0x8000000080000;
        auVar46._12_4_ = 0x80000;
        auVar46._16_4_ = 0x80000;
        auVar46._20_4_ = 0x80000;
        auVar46._24_4_ = 0x80000;
        auVar46._28_4_ = 0x80000;
        do {
          if (-2 < width) {
            lVar22 = -1;
            iVar14 = width + 2;
            do {
              auVar33 = vpaddd_avx2(*(undefined1 (*) [32])(lVar19 + 0x7ea4 + lVar22 * 4),
                                    *(undefined1 (*) [32])(lVar28 + 0x7ea4 + lVar22 * 4));
              auVar33 = vpsubd_avx2(*(undefined1 (*) [32])(lVar20 + 0x7ea4 + lVar22 * 4),auVar33);
              auVar33 = vpaddd_avx2(auVar33,*(undefined1 (*) [32])(lVar21 + 0x7ea4 + lVar22 * 4));
              auVar52 = vpaddd_avx2(*(undefined1 (*) [32])(lVar19 + 4 + lVar22 * 4),
                                    *(undefined1 (*) [32])(lVar28 + 4 + lVar22 * 4));
              auVar52 = vpsubd_avx2(*(undefined1 (*) [32])(lVar20 + 4 + lVar22 * 4),auVar52);
              auVar52 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar21 + 4 + lVar22 * 4));
              if (iVar14 < 8) {
                auVar33 = vpand_avx2(*(undefined1 (*) [32])(local_160 + (long)iVar14 * 0x20),auVar33
                                    );
                auVar52 = vpand_avx2(auVar52,*(undefined1 (*) [32])(local_160 + (long)iVar14 * 0x20)
                                    );
              }
              if (bit_depth < 9) {
                auVar40 = vpmaddwd_avx2(auVar33,auVar33);
                auVar52 = vpmulld_avx2(auVar52,auVar36);
              }
              else {
                auVar52 = vpaddd_avx2(auVar52,auVar39);
                auVar41 = vpsrld_avx2(auVar52,ZEXT416(uVar24));
                auVar52 = vpaddd_avx2(auVar33,auVar42);
                auVar52 = vpsrld_avx2(auVar52,ZEXT416(bit_depth - 8U));
                auVar40 = vpmaddwd_avx2(auVar52,auVar52);
                auVar52 = vpmulld_avx2(auVar41,auVar36);
                auVar52 = vpmaxsd_avx2(auVar52,auVar40);
              }
              auVar52 = vpsubd_avx2(auVar52,auVar40);
              auVar52 = vpmulld_avx2(auVar52,auVar31);
              auVar52 = vpaddd_avx2(auVar52,auVar46);
              auVar52 = vpsrld_avx2(auVar52,0x14);
              auVar56._8_4_ = 0xff;
              auVar56._0_8_ = 0xff000000ff;
              auVar56._12_4_ = 0xff;
              auVar56._16_4_ = 0xff;
              auVar56._20_4_ = 0xff;
              auVar56._24_4_ = 0xff;
              auVar56._28_4_ = 0xff;
              vpminud_avx2(auVar52,auVar56);
              auVar52 = vpcmpeqd_avx2(in_ZMM11._0_32_,in_ZMM11._0_32_);
              auVar52 = vpgatherdd(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar52);
              in_ZMM11 = ZEXT3264((undefined1  [32])0x0);
              auVar53._8_4_ = 0x100;
              auVar53._0_8_ = 0x10000000100;
              auVar53._12_4_ = 0x100;
              auVar53._16_4_ = 0x100;
              auVar53._20_4_ = 0x100;
              auVar53._24_4_ = 0x100;
              auVar53._28_4_ = 0x100;
              *(undefined1 (*) [32])((long)pvVar11 + lVar22 * 4 + 0x2c) = auVar52;
              auVar52 = vpsubd_avx2(auVar53,auVar52);
              auVar52 = vpmaddwd_avx2(auVar52,auVar34);
              auVar33 = vpmulld_avx2(auVar52,auVar33);
              auVar54._8_4_ = 0x800;
              auVar54._0_8_ = 0x80000000800;
              auVar54._12_4_ = 0x800;
              auVar54._16_4_ = 0x800;
              auVar54._20_4_ = 0x800;
              auVar54._24_4_ = 0x800;
              auVar54._28_4_ = 0x800;
              auVar33 = vpaddd_avx2(auVar33,auVar54);
              auVar33 = vpsrld_avx2(auVar33,0xc);
              *(undefined1 (*) [32])((long)pvVar11 + lVar22 * 4 + 0x7ecc) = auVar33;
              lVar22 = lVar22 + 8;
              iVar14 = iVar14 + -8;
            } while (lVar22 <= width);
          }
          uVar6 = uVar6 + 1;
          pvVar11 = (void *)((long)pvVar11 + lVar15);
          lVar21 = lVar21 + lVar15;
          lVar19 = lVar19 + lVar15;
          lVar28 = lVar28 + lVar15;
          lVar20 = lVar20 + lVar15;
        } while (uVar6 != height + 1);
        puVar27 = (uint8_t *)((long)dgd8 * 2);
        if (highbd == 0) {
          puVar27 = dgd8;
        }
        if (0 < height) {
          lVar28 = (long)memblk + lVar5 * 8 + lVar16 * 4 + 0x7ed0;
          lVar21 = (long)memblk + lVar5 * 4 + lVar16 * 4 + 0x7ed0;
          lVar5 = (long)memblk + lVar16 * 4 + 0x7ed0;
          iVar14 = 0;
          auVar32._8_4_ = 0x100;
          auVar32._0_8_ = 0x10000000100;
          auVar32._12_4_ = 0x100;
          auVar32._16_4_ = 0x100;
          auVar32._20_4_ = 0x100;
          auVar32._24_4_ = 0x100;
          auVar32._28_4_ = 0x100;
          uVar6 = 0;
          local_168 = flt1;
          do {
            if (0 < width) {
              lVar16 = 0;
              do {
                if (highbd == 0) {
                  auVar33 = vpmovzxbd_avx2(*(undefined1 (*) [16])
                                            (puVar27 + (iVar14 + (int)lVar16 << (bVar7 & 0x1f))));
                }
                else {
                  auVar33 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                            (puVar27 + (iVar14 + (int)lVar16 << (bVar7 & 0x1f))));
                }
                auVar52 = vpaddd_avx2(*(undefined1 (*) [32])(lVar5 + -0x7ea0 + lVar16 * 4),
                                      *(undefined1 (*) [32])(lVar5 + -0x7ea8 + lVar16 * 4));
                auVar52 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar28 + -0x7ea8 + lVar16 * 4))
                ;
                auVar52 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar28 + -0x7ea0 + lVar16 * 4))
                ;
                auVar40 = vpaddd_avx2(*(undefined1 (*) [32])(lVar21 + -0x7ea8 + lVar16 * 4),
                                      *(undefined1 (*) [32])(lVar5 + -0x7ea4 + lVar16 * 4));
                auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])(lVar21 + -0x7ea4 + lVar16 * 4))
                ;
                auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])(lVar21 + -0x7ea0 + lVar16 * 4))
                ;
                auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])(lVar28 + -0x7ea4 + lVar16 * 4))
                ;
                auVar40 = vpaddd_avx2(auVar40,auVar52);
                auVar40 = vpslld_avx2(auVar40,2);
                auVar41 = vpsubd_avx2(auVar40,auVar52);
                auVar52 = vpaddd_avx2(*(undefined1 (*) [32])(lVar5 + lVar16 * 4),
                                      *(undefined1 (*) [32])(lVar5 + -8 + lVar16 * 4));
                auVar52 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar28 + -8 + lVar16 * 4));
                auVar52 = vpaddd_avx2(auVar52,*(undefined1 (*) [32])(lVar28 + lVar16 * 4));
                auVar40 = vpaddd_avx2(*(undefined1 (*) [32])(lVar21 + -8 + lVar16 * 4),
                                      *(undefined1 (*) [32])(lVar5 + -4 + lVar16 * 4));
                auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])(lVar21 + -4 + lVar16 * 4));
                auVar40 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])(lVar21 + lVar16 * 4));
                auVar41 = vpmaddwd_avx2(auVar41,auVar33);
                auVar33 = vpaddd_avx2(auVar40,*(undefined1 (*) [32])(lVar28 + -4 + lVar16 * 4));
                auVar33 = vpaddd_avx2(auVar33,auVar52);
                auVar33 = vpslld_avx2(auVar33,2);
                auVar33 = vpaddd_avx2(auVar33,auVar32);
                auVar52 = vpsubd_avx2(auVar41,auVar52);
                auVar33 = vpaddd_avx2(auVar52,auVar33);
                auVar33 = vpsrad_avx2(auVar33,9);
                *(undefined1 (*) [32])(local_168 + lVar16) = auVar33;
                lVar16 = lVar16 + 8;
              } while (lVar16 < width);
            }
            uVar6 = uVar6 + 1;
            local_168 = local_168 + flt_stride;
            iVar14 = iVar14 + dgd_stride;
            lVar28 = lVar28 + lVar15;
            lVar21 = lVar21 + lVar15;
            lVar5 = lVar5 + lVar15;
          } while (uVar6 != (uint)height);
        }
      }
    }
    aom_free(memblk);
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

int av1_selfguided_restoration_avx2(const uint8_t *dgd8, int width, int height,
                                    int dgd_stride, int32_t *flt0,
                                    int32_t *flt1, int flt_stride,
                                    int sgr_params_idx, int bit_depth,
                                    int highbd) {
  // The ALIGN_POWER_OF_TWO macro here ensures that column 1 of Atl, Btl,
  // Ctl and Dtl is 32-byte aligned.
  const int buf_elts = ALIGN_POWER_OF_TWO(RESTORATION_PROC_UNIT_PELS, 3);

  int32_t *buf = aom_memalign(
      32, 4 * sizeof(*buf) * ALIGN_POWER_OF_TWO(RESTORATION_PROC_UNIT_PELS, 3));
  if (!buf) return -1;

  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;

  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 32 bytes for efficiency.
  int buf_stride = ALIGN_POWER_OF_TWO(width_ext + 16, 3);

  // The "tl" pointers point at the top-left of the initialised data for the
  // array.
  int32_t *Atl = buf + 0 * buf_elts + 7;
  int32_t *Btl = buf + 1 * buf_elts + 7;
  int32_t *Ctl = buf + 2 * buf_elts + 7;
  int32_t *Dtl = buf + 3 * buf_elts + 7;

  // The "0" pointers are (- SGRPROJ_BORDER_VERT, -SGRPROJ_BORDER_HORZ). Note
  // there's a zero row and column in A, B (integral images), so we move down
  // and right one for them.
  const int buf_diag_border =
      SGRPROJ_BORDER_HORZ + buf_stride * SGRPROJ_BORDER_VERT;

  int32_t *A0 = Atl + 1 + buf_stride;
  int32_t *B0 = Btl + 1 + buf_stride;
  int32_t *C0 = Ctl + 1 + buf_stride;
  int32_t *D0 = Dtl + 1 + buf_stride;

  // Finally, A, B, C, D point at position (0, 0).
  int32_t *A = A0 + buf_diag_border;
  int32_t *B = B0 + buf_diag_border;
  int32_t *C = C0 + buf_diag_border;
  int32_t *D = D0 + buf_diag_border;

  const int dgd_diag_border =
      SGRPROJ_BORDER_HORZ + dgd_stride * SGRPROJ_BORDER_VERT;
  const uint8_t *dgd0 = dgd8 - dgd_diag_border;

  // Generate integral images from the input. C will contain sums of squares; D
  // will contain just sums
  if (highbd)
    integral_images_highbd(CONVERT_TO_SHORTPTR(dgd0), dgd_stride, width_ext,
                           height_ext, Ctl, Dtl, buf_stride);
  else
    integral_images(dgd0, dgd_stride, width_ext, height_ext, Ctl, Dtl,
                    buf_stride);

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // Write to flt0 and flt1
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));
  assert(params->r[0] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));
  assert(params->r[1] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));

  if (params->r[0] > 0) {
    calc_ab_fast(A, B, C, D, width, height, buf_stride, bit_depth,
                 sgr_params_idx, 0);
    final_filter_fast(flt0, flt_stride, A, B, buf_stride, dgd8, dgd_stride,
                      width, height, highbd);
  }

  if (params->r[1] > 0) {
    calc_ab(A, B, C, D, width, height, buf_stride, bit_depth, sgr_params_idx,
            1);
    final_filter(flt1, flt_stride, A, B, buf_stride, dgd8, dgd_stride, width,
                 height, highbd);
  }
  aom_free(buf);
  return 0;
}